

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_prepare_mlsag
              (uint8_t *m,uint8_t *sk,size_t nOuts,size_t nBlinded,size_t nCols,size_t nRows,
              uint8_t **pcm_in,uint8_t **pcm_out,uint8_t **blinds)

{
  int iVar1;
  undefined1 *puVar2;
  ulong in_RCX;
  ulong in_RDX;
  uchar *in_RSI;
  long in_RDI;
  secp256k1_gej *in_R8;
  secp256k1_gej *in_R9;
  secp256k1_scalar ts;
  secp256k1_scalar accis;
  secp256k1_scalar accos;
  int overflow;
  size_t k;
  size_t i;
  size_t s;
  size_t nIns;
  secp256k1_ge cno;
  secp256k1_ge c;
  secp256k1_gej accj;
  secp256k1_gej *in_stack_fffffffffffffe08;
  secp256k1_gej *in_stack_fffffffffffffe10;
  secp256k1_ge *in_stack_fffffffffffffe18;
  secp256k1_scalar *in_stack_fffffffffffffe20;
  secp256k1_scalar *in_stack_fffffffffffffe30;
  secp256k1_scalar *in_stack_fffffffffffffe38;
  secp256k1_scalar *in_stack_fffffffffffffe40;
  secp256k1_gej *in_stack_fffffffffffffe58;
  secp256k1_ge *in_stack_fffffffffffffe60;
  int local_18c;
  secp256k1_gej *local_188;
  undefined1 *local_180;
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_ge *in_stack_ffffffffffffffc0;
  int local_4;
  
  puVar2 = &in_R9[-1].field_0x7f;
  if ((((in_RDI == 0) || (in_R9 < (secp256k1_gej *)0x2)) || (in_R8 == (secp256k1_gej *)0x0)) ||
     (in_RDX == 0)) {
    local_4 = 1;
  }
  else {
    secp256k1_gej_set_infinity((secp256k1_gej *)0x1187fc);
    for (local_188 = (secp256k1_gej *)0x0; local_188 < in_RDX;
        local_188 = (secp256k1_gej *)((long)local_188 + 1)) {
      iVar1 = load_ge(in_stack_fffffffffffffe18,(uint8_t *)in_stack_fffffffffffffe10,
                      (size_t)in_stack_fffffffffffffe08);
      if (iVar1 == 0) {
        return 2;
      }
      secp256k1_gej_add_ge_var(in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    secp256k1_gej_neg(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    secp256k1_ge_set_gej(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    for (local_188 = (secp256k1_gej *)0x0; local_188 < in_R8;
        local_188 = (secp256k1_gej *)((long)(local_188->x).n + 1)) {
      secp256k1_gej_set_infinity((secp256k1_gej *)0x1188c6);
      for (local_180 = (undefined1 *)0x0; local_180 < puVar2; local_180 = local_180 + 1) {
        iVar1 = load_ge(in_stack_fffffffffffffe18,(uint8_t *)in_stack_fffffffffffffe10,
                        (size_t)in_stack_fffffffffffffe08);
        if (iVar1 == 0) {
          return 3;
        }
        secp256k1_gej_add_ge_var(in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      secp256k1_gej_add_ge_var(in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&stack0xffffffffffffff48);
      if (iVar1 == 0) {
        secp256k1_ge_set_gej(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
        secp256k1_eckey_pubkey_serialize
                  (in_stack_fffffffffffffe18,(uchar *)in_stack_fffffffffffffe10,
                   (size_t *)in_stack_fffffffffffffe08,0);
      }
      else {
        memset((void *)(in_RDI + (long)((long)(local_188->x).n + (long)in_R8 * (long)puVar2) * 0x21)
               ,0,0x21);
      }
    }
    if ((in_RSI == (uchar *)0x0) || (ts.d[2] == 0)) {
      local_4 = 0;
    }
    else {
      secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffe30);
      for (local_188 = (secp256k1_gej *)0x0; local_188 < puVar2;
          local_188 = (secp256k1_gej *)((long)local_188 + 1)) {
        secp256k1_scalar_set_b32
                  (in_stack_fffffffffffffe20,(uchar *)in_stack_fffffffffffffe18,
                   (int *)in_stack_fffffffffffffe10);
        if (local_18c != 0) {
          return 5;
        }
        secp256k1_scalar_add
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      }
      secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffe50);
      for (local_188 = (secp256k1_gej *)0x0; local_188 < in_RCX;
          local_188 = (secp256k1_gej *)((long)local_188 + 1)) {
        secp256k1_scalar_set_b32
                  (in_stack_fffffffffffffe20,(uchar *)in_stack_fffffffffffffe18,
                   (int *)in_stack_fffffffffffffe10);
        if (local_18c != 0) {
          return 5;
        }
        secp256k1_scalar_add
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      }
      secp256k1_scalar_negate
                (in_stack_fffffffffffffe20,(secp256k1_scalar *)in_stack_fffffffffffffe18);
      secp256k1_scalar_add
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      secp256k1_scalar_get_b32(in_RSI,(secp256k1_scalar *)&stack0xfffffffffffffe10);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_prepare_mlsag(uint8_t *m, uint8_t *sk,
    size_t nOuts, size_t nBlinded, size_t nCols, size_t nRows,
    const uint8_t **pcm_in, const uint8_t **pcm_out, const uint8_t **blinds)
{
    /*
        Last matrix row is sum of input commitments - sum of output commitments

        Will return after summing commitments if sk or blinds is null

        m[col+(cols*row)]
        pcm_in[col+(cols*row)]
        pcm_out[nOuts]

        blinds[nBlinded]  array of pointers to 32byte blinding keys, inputs and outputs

        no. of inputs is nRows -1

        sum blinds up to nBlinded, pass fee commitment in pcm_out after nBlinded

    */

    secp256k1_gej accj;
    secp256k1_ge c, cno;
    size_t nIns = nRows -1;
    size_t s, i, k;
    int overflow;
    secp256k1_scalar accos, accis, ts;

    if (!m
        || nRows < 2
        || nCols < 1
        || nOuts < 1) {
        return 1;
    }

    /* sum output commitments */
    secp256k1_gej_set_infinity(&accj);
    for (k = 0; k < nOuts; ++k) {
        if (!load_ge(&c, pcm_out[k], 33)) {
            return 2;
        }
        secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
    }

    secp256k1_gej_neg(&accj, &accj);
    secp256k1_ge_set_gej(&cno, &accj);

    for (k = 0; k < nCols; ++k) {
        /* sum column input commitments */
        secp256k1_gej_set_infinity(&accj);
        for (i = 0; i < nIns; ++i) {
            if (!load_ge(&c, pcm_in[k+nCols*i], 33)) {
                return 3;
            }
            secp256k1_gej_add_ge_var(&accj, &accj, &c, NULL);
        }

        /* subtract output commitments */
        secp256k1_gej_add_ge_var(&accj, &accj, &cno, NULL);

        /* store in last row, nRows -1 */
        if (secp256k1_gej_is_infinity(&accj)) {
            /* With no blinds set, sum input commitments == sum output commitments */
            memset(&m[(k+nCols*nIns)*33], 0, 33); /* consistent infinity point */
            continue;
        }
        secp256k1_ge_set_gej(&c, &accj);
        secp256k1_eckey_pubkey_serialize(&c, &m[(k+nCols*nIns)*33], &s, 1);
        /* pedersen_commitment_save(&m[(k+nCols*nIns)*33], &c); */
    }

    if (!sk || !blinds) {
        return 0;
    }

    /* sum input blinds */
    secp256k1_scalar_clear(&accis);
    for (k = 0; k < nIns; ++k) {
        secp256k1_scalar_set_b32(&ts, blinds[k], &overflow);
        if (overflow) {
            return 5;
        }
        secp256k1_scalar_add(&accis, &accis, &ts);
    }

    /* sum output blinds */
    secp256k1_scalar_clear(&accos);
    for (k = 0; k < nBlinded; ++k) {
        secp256k1_scalar_set_b32(&ts, blinds[nIns+k], &overflow);
        if (overflow) {
            return 5;
        }
        secp256k1_scalar_add(&accos, &accos, &ts);
    }

    secp256k1_scalar_negate(&accos, &accos);

    /* subtract output blinds */
    secp256k1_scalar_add(&ts, &accis, &accos);

    secp256k1_scalar_get_b32(sk, &ts);

    return 0;
}